

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerqueue_unittest.cpp
# Opt level: O2

void cancel(TimerId timer)

{
  self *this;
  SourceFile file;
  Logger local_1018;
  undefined1 local_48 [12];
  string local_38;
  Timestamp local_18;
  
  sznet::net::EventLoop::cancel(g_timequeue_loop,timer);
  if (sznet::g_logLevel < 3) {
    sznet::Logger::SourceFile::SourceFile<111>
              ((SourceFile *)local_48,
               (char (*) [111])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/timer/timerqueue_unittest.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_48._0_8_;
    file.m_size = local_48._8_4_;
    sznet::Logger::Logger(&local_1018,file,0x27);
    this = sznet::LogStream::operator<<(&local_1018.m_impl.m_stream,"cancelled at ");
    local_18 = sznet::Timestamp::now();
    sznet::Timestamp::toFormattedString_abi_cxx11_(&local_38,&local_18,true);
    sznet::LogStream::operator<<(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    sznet::Logger::~Logger(&local_1018);
  }
  return;
}

Assistant:

void cancel(TimerId timer)
{
	g_timequeue_loop->cancel(timer);
	LOG_INFO << "cancelled at " << Timestamp::now().toFormattedString();
}